

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O2

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid,H264_SPS_t *sps,H264_subSPS_t *subset_sps)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  h264_dec_ctx_t *phVar5;
  byte bVar6;
  MPP_RET MVar7;
  RK_U32 RVar8;
  int iVar9;
  uint uVar10;
  RK_U32 RVar11;
  int iVar12;
  char *fmt;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  
  if ((p_Vid == (H264dVideoCtx_t *)0x0 && sps == (H264_SPS_t *)0x0) &&
      subset_sps == (H264_subSPS_t *)0x0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    fmt = "input empty(%d).\n";
    MVar7 = MPP_OK;
    uVar16 = 0x245;
LAB_0018b54a:
    _mpp_log_l(4,"h264d_sps",fmt,(char *)0x0,uVar16);
    return MVar7;
  }
  if ((p_Vid->dec_pic != (h264_store_pic_t *)0x0) &&
     (MVar7 = exit_picture(p_Vid,&p_Vid->dec_pic), MVar7 < MPP_OK)) {
    if (((byte)h264d_debug & 4) == 0) {
      return MVar7;
    }
    fmt = "Function error(%d).\n";
    uVar16 = 0x247;
    goto LAB_0018b54a;
  }
  if (p_Vid->active_mvc_sps_flag == 0) {
    p_Vid->active_sps = sps;
    p_Vid->active_subsps = (h264_subsps_t *)0x0;
    p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
    p_Vid->active_sps_id[1] = 0;
    RVar8 = video_pars_changed(p_Vid,sps,'\0');
    if (RVar8 == 0) {
      RVar8 = p_Vid->dpb_size[0];
    }
    else {
      if ((p_Vid->no_output_of_prior_pics_flag == 0) &&
         (MVar7 = flush_dpb(p_Vid->p_Dpb_layer[0],1), MVar7 < MPP_OK)) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar7;
        }
        fmt = "Function error(%d).\n";
        uVar16 = 0x263;
        goto LAB_0018b54a;
      }
      MVar7 = init_dpb(p_Vid,p_Vid->p_Dpb_layer[0],1);
      if (MVar7 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar7;
        }
        fmt = "Function error(%d).\n";
        uVar16 = 0x265;
        goto LAB_0018b54a;
      }
      sps = p_Vid->active_sps;
      p_Vid->last_pic_width_in_mbs_minus1[0] = (((H264_subSPS_t *)sps)->sps).pic_width_in_mbs_minus1
      ;
      p_Vid->last_pic_height_in_map_units_minus1[0] =
           (((H264_subSPS_t *)sps)->sps).pic_height_in_map_units_minus1;
      p_Vid->last_profile_idc[0] = (((H264_subSPS_t *)sps)->sps).profile_idc;
      p_Vid->last_level_idc[0] = (((H264_subSPS_t *)sps)->sps).level_idc;
      RVar8 = p_Vid->p_Dpb_layer[0]->size;
      p_Vid->dpb_size[0] = RVar8;
      p_Vid->spspps_update = 1;
    }
    subset_sps = (H264_subSPS_t *)sps;
    if (RVar8 == 0) {
      MVar7 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      fmt = "value error(%d).\n";
      uVar16 = 0x26b;
      goto LAB_0018b54a;
    }
  }
  else {
    p_Vid->active_sps = &subset_sps->sps;
    p_Vid->active_subsps = subset_sps;
    p_Vid->active_sps_id[0] = 0;
    p_Vid->active_sps_id[1] = (subset_sps->sps).seq_parameter_set_id;
    RVar8 = video_pars_changed(p_Vid,&subset_sps->sps,'\x01');
    if (RVar8 != 0) {
      MVar7 = flush_dpb(p_Vid->p_Dpb_layer[1],2);
      if (MVar7 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar7;
        }
        fmt = "Function error(%d).\n";
        uVar16 = 0x24f;
        goto LAB_0018b54a;
      }
      MVar7 = init_dpb(p_Vid,p_Vid->p_Dpb_layer[1],2);
      if (MVar7 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar7;
        }
        fmt = "Function error(%d).\n";
        uVar16 = 0x250;
        goto LAB_0018b54a;
      }
      MVar7 = check_mvc_dpb(p_Vid,p_Vid->p_Dpb_layer[0],p_Vid->p_Dpb_layer[1]);
      if (MVar7 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar7;
        }
        fmt = "Function error(%d).\n";
        uVar16 = 0x251;
        goto LAB_0018b54a;
      }
      subset_sps = (H264_subSPS_t *)p_Vid->active_sps;
      phVar5 = p_Vid->p_Dec;
      p_Vid->last_pic_width_in_mbs_minus1[1] = (subset_sps->sps).pic_width_in_mbs_minus1;
      p_Vid->last_pic_height_in_map_units_minus1[1] =
           (subset_sps->sps).pic_height_in_map_units_minus1;
      p_Vid->last_profile_idc[1] = (subset_sps->sps).profile_idc;
      p_Vid->last_level_idc[1] = (subset_sps->sps).level_idc;
      uVar3 = p_Vid->p_Dpb_layer[1]->size;
      p_Vid->dpb_size[1] = uVar3;
      p_Vid->spspps_update = 1;
      if (uVar3 != 0 && phVar5->mvc_valid != '\0') {
        uVar10 = 8;
        if (uVar3 < 8) {
          uVar10 = uVar3;
        }
        p_Vid->p_Dpb_layer[0]->size = uVar10;
        p_Vid->dpb_size[0] = uVar10;
      }
    }
    if (p_Vid->dpb_size[1] == 0) {
      MVar7 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) == 0) {
        return MPP_ERR_VALUE;
      }
      fmt = "value error(%d).\n";
      uVar16 = 0x25b;
      goto LAB_0018b54a;
    }
  }
  if ((h264d_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264d_sps","[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",(char *)0x0,
               (ulong)p_Vid->dpb_size[0],(ulong)(uint)p_Vid->active_mvc_sps_flag,p_Vid->dpb_size[1])
    ;
    subset_sps = (H264_subSPS_t *)p_Vid->active_sps;
  }
  bVar6 = (char)(subset_sps->sps).log2_max_frame_num_minus4 + 4U & 0x1f;
  p_Vid->max_frame_num = 1 << bVar6;
  RVar8 = (subset_sps->sps).pic_width_in_mbs_minus1 + 1;
  p_Vid->PicWidthInMbs = RVar8;
  iVar4 = (subset_sps->sps).frame_mbs_only_flag;
  RVar11 = ((subset_sps->sps).pic_height_in_map_units_minus1 + 1) * (2 - iVar4);
  p_Vid->FrameHeightInMbs = RVar11;
  iVar14 = (subset_sps->sps).chroma_format_idc;
  lVar13 = (long)iVar14;
  iVar9 = RVar8 * 0x10;
  iVar12 = RVar11 * 0x10;
  p_Vid->yuv_format = iVar14;
  p_Vid->frame_mbs_only_flag = iVar4;
  p_Vid->width = iVar9;
  p_Vid->height = iVar12;
  uVar1 = (subset_sps->sps).bit_depth_luma_minus8;
  uVar2 = (subset_sps->sps).bit_depth_chroma_minus8;
  p_Vid->bit_depth_chroma = uVar2 + 8;
  p_Vid->bit_depth_luma = uVar1 + 8;
  if (lVar13 == 2) {
    p_Vid->width_cr = iVar9 >> 1;
    iVar14 = iVar12;
  }
  else {
    if (iVar14 != 1) goto LAB_0018b784;
    p_Vid->width_cr = iVar9 >> 1;
    iVar14 = iVar12 >> 1;
  }
  p_Vid->height_cr = iVar14;
LAB_0018b784:
  iVar14 = 0;
  iVar15 = 0;
  if ((subset_sps->sps).frame_cropping_flag != 0) {
    iVar14 = ((subset_sps->sps).frame_crop_right_offset + (subset_sps->sps).frame_crop_left_offset)
             * h264e_sps_to_packet::SubWidthC[lVar13];
    iVar15 = ((subset_sps->sps).frame_crop_bottom_offset + (subset_sps->sps).frame_crop_top_offset)
             * (iVar4 + -2) * h264e_sps_to_packet::SubHeightC[lVar13];
  }
  p_Vid->width_after_crop = iVar9 - iVar14;
  p_Vid->height_after_crop = iVar15 + iVar12;
  return 0 << bVar6;
}

Assistant:

MPP_RET activate_sps(H264dVideoCtx_t *p_Vid, H264_SPS_t *sps, H264_subSPS_t *subset_sps)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    INP_CHECK(ret, !p_Vid && !sps && !subset_sps);
    if (p_Vid->dec_pic) {
        FUN_CHECK(ret = exit_picture(p_Vid, &p_Vid->dec_pic));
    }
    if (p_Vid->active_mvc_sps_flag) { // layer_id == 1
        p_Vid->active_sps = &subset_sps->sps;
        p_Vid->active_subsps = subset_sps;
        p_Vid->active_sps_id[0] = 0;
        p_Vid->active_sps_id[1] = subset_sps->sps.seq_parameter_set_id;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 1)) {
            FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[1], 2));
            FUN_CHECK(ret = check_mvc_dpb(p_Vid, p_Vid->p_Dpb_layer[0], p_Vid->p_Dpb_layer[1]));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 1);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[1] = p_Vid->p_Dpb_layer[1]->size;
            p_Vid->spspps_update = 1;
            if (p_Vid->p_Dec->mvc_valid && p_Vid->p_Dpb_layer[1]->size > 0) {
                p_Vid->p_Dpb_layer[0]->size = MPP_MIN(p_Vid->p_Dpb_layer[1]->size, MAX_DPB_SIZE / 2);
                p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            }
        }
        VAL_CHECK(ret, p_Vid->dpb_size[1] > 0);
    } else { //!< layer_id == 0
        p_Vid->active_sps = sps;
        p_Vid->active_subsps = NULL;
        p_Vid->active_sps_id[0] = sps->seq_parameter_set_id;
        p_Vid->active_sps_id[1] = 0;
        if (video_pars_changed(p_Vid, p_Vid->active_sps, 0)) {
            if (!p_Vid->no_output_of_prior_pics_flag) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            }
            FUN_CHECK(ret = init_dpb(p_Vid, p_Vid->p_Dpb_layer[0], 1));
            update_last_video_pars(p_Vid, p_Vid->active_sps, 0);
            //!< init frame slots, store frame buffer size
            p_Vid->dpb_size[0] = p_Vid->p_Dpb_layer[0]->size;
            p_Vid->spspps_update = 1;
        }
        VAL_CHECK(ret, p_Vid->dpb_size[0] > 0);
    }
    H264D_DBG(H264D_DBG_DPB_INFO, "[DPB_size] dpb_size[0]=%d, mvc_flag=%d, dpb_size[1]=%d",
              p_Vid->dpb_size[0], p_Vid->active_mvc_sps_flag, p_Vid->dpb_size[1]);
    update_video_pars(p_Vid, p_Vid->active_sps);
__RETURN:
    return ret = MPP_OK;
__FAILED:
    return ret;
}